

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RoboSimian.h
# Opt level: O2

void __thiscall chrono::robosimian::LinkData::~LinkData(LinkData *this)

{
  Link::~Link(&this->link);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

struct CH_MODELS_API LinkData {
    LinkData(std::string myname, Link mylink, bool inc) : name(myname), link(mylink), include(inc) {}
    ////LinkData(LinkData&&) {}

    std::string name;
    Link link;
    bool include;
}